

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O1

char * assignGapColorForO(float gap,int class)

{
  char *pcVar1;
  
  if (class == 6) {
    return "pale_green ";
  }
  if (0.35 < gap) {
    return "cornflower_blue ";
  }
  if (0.25 < gap) {
    return "sky_blue ";
  }
  if (0.15 < gap) {
    return "aquamarine ";
  }
  if (0.0 < gap) {
    return "green ";
  }
  if (-0.1 < gap) {
    return "yellow_green ";
  }
  if (-0.2 < gap) {
    return "yellow ";
  }
  if (-0.3 < gap) {
    return "orange ";
  }
  pcVar1 = "orange_red ";
  if (-0.4 < gap) {
    pcVar1 = "red ";
  }
  return pcVar1;
}

Assistant:

char* assignGapColorForO(float gap, int class)
{
   char *colorValue = "";
   //if (class == 4)     { colorValue = "pale_green ";      } /* hbond *//* 04/16/2015 SJ changed 4 to 6, as H-bond are now 6 in NODEWIDTH, see probe.h*/
   if (class == 6)     { colorValue = "pale_green ";      }
   else if (gap > 0.35){ colorValue = "cornflower_blue "; }
   else if (gap > 0.25){ colorValue = "sky_blue ";        }
   else if (gap > 0.15){ colorValue = "aquamarine ";      }
   else if (gap > 0.0) { colorValue = "green ";           }
   else if (gap >-0.1) { colorValue = "yellow_green ";    }
   else if (gap >-0.2) { colorValue = "yellow ";          }
   else if (gap >-0.3) { colorValue = "orange ";          }
   else if (gap >-0.4) { colorValue = "red ";             }
   else                { colorValue = "orange_red ";      }
   return colorValue;
}